

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O3

void utest_utils_utils_extract_base_path(int *utest_result,size_t utest_index)

{
  FILE *pFVar1;
  int iVar2;
  char *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_type __dnew;
  string local_78;
  size_type local_58;
  string local_50;
  
  paVar4 = &local_78.field_2;
  local_58 = 0x11;
  local_78._M_dataplus._M_p = (pointer)paVar4;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_58);
  local_78.field_2._M_local_buf[0] = (char)local_58;
  local_78.field_2._M_allocated_capacity._1_2_ = (undefined2)(local_58 >> 8);
  local_78.field_2._M_local_buf[3] = (char)(local_58 >> 0x18);
  local_78.field_2._M_allocated_capacity._4_2_ = (undefined2)(local_58 >> 0x20);
  local_78.field_2._M_local_buf[6] = (char)(local_58 >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)(local_58 >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"/path/to/file.txt",0x11);
  local_78._M_string_length = local_58;
  local_78._M_dataplus._M_p[local_58] = '\0';
  ExtractBasePath(&local_50,&local_78);
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  paVar5 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar5) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar4) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                               CONCAT13(local_78.field_2._M_local_buf[3],
                                                        CONCAT21(local_78.field_2.
                                                                 _M_allocated_capacity._1_2_,
                                                                 local_78.field_2._M_local_buf[0])))
                                     )) + 1);
  }
  if (iVar2 != 0) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0x13a);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0x13a);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      local_58 = 0x11;
      local_78._M_dataplus._M_p = (pointer)paVar4;
      local_78._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_58);
      local_78.field_2._M_local_buf[0] = (char)local_58;
      local_78.field_2._M_allocated_capacity._1_2_ = (undefined2)(local_58 >> 8);
      local_78.field_2._M_local_buf[3] = (char)(local_58 >> 0x18);
      local_78.field_2._M_allocated_capacity._4_2_ = (undefined2)(local_58 >> 0x20);
      local_78.field_2._M_local_buf[6] = (char)(local_58 >> 0x30);
      local_78.field_2._M_local_buf[7] = (char)(local_58 >> 0x38);
      builtin_strncpy(local_78._M_dataplus._M_p,"/path/to/file.txt",0x11);
      local_78._M_string_length = local_58;
      local_78._M_dataplus._M_p[local_58] = '\0';
      ExtractBasePath(&local_50,&local_78);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      pcVar3 = "false";
      if (iVar2 == 0) {
        pcVar3 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar5) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT17(local_78.field_2._M_local_buf[7],
                                 CONCAT16(local_78.field_2._M_local_buf[6],
                                          CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_78.field_2._M_local_buf[3],
                                                            CONCAT21(local_78.field_2.
                                                                     _M_allocated_capacity._1_2_,
                                                                     local_78.field_2._M_local_buf
                                                                     [0]))))) + 1);
      }
    }
    local_58 = 0x11;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_58);
    local_78.field_2._M_local_buf[0] = (char)local_58;
    local_78.field_2._M_allocated_capacity._1_2_ = (undefined2)(local_58 >> 8);
    local_78.field_2._M_local_buf[3] = (char)(local_58 >> 0x18);
    local_78.field_2._M_allocated_capacity._4_2_ = (undefined2)(local_58 >> 0x20);
    local_78.field_2._M_local_buf[6] = (char)(local_58 >> 0x30);
    local_78.field_2._M_local_buf[7] = (char)(local_58 >> 0x38);
    builtin_strncpy(local_78._M_dataplus._M_p,"/path/to/file.txt",0x11);
    local_78._M_string_length = local_58;
    local_78._M_dataplus._M_p[local_58] = '\0';
    ExtractBasePath(&local_50,&local_78);
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    pcVar3 = "false";
    if (iVar2 == 0) {
      pcVar3 = "true";
    }
    printf("    Actual : %s\n",pcVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar5) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT17(local_78.field_2._M_local_buf[7],
                               CONCAT16(local_78.field_2._M_local_buf[6],
                                        CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                 CONCAT13(local_78.field_2._M_local_buf[3],
                                                          CONCAT21(local_78.field_2.
                                                                   _M_allocated_capacity._1_2_,
                                                                   local_78.field_2._M_local_buf[0])
                                                         )))) + 1);
    }
    *utest_result = 1;
  }
  paVar4 = &local_78.field_2;
  local_58 = 0x1a;
  local_78._M_dataplus._M_p = (pointer)paVar4;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_58);
  local_78.field_2._M_local_buf[0] = (char)local_58;
  local_78.field_2._M_allocated_capacity._1_2_ = (undefined2)(local_58 >> 8);
  local_78.field_2._M_local_buf[3] = (char)(local_58 >> 0x18);
  local_78.field_2._M_allocated_capacity._4_2_ = (undefined2)(local_58 >> 0x20);
  local_78.field_2._M_local_buf[6] = (char)(local_58 >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)(local_58 >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"/path/to/another.file.docx",0x1a);
  local_78._M_string_length = local_58;
  local_78._M_dataplus._M_p[local_58] = '\0';
  ExtractBasePath(&local_50,&local_78);
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar5) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar4) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                               CONCAT13(local_78.field_2._M_local_buf[3],
                                                        CONCAT21(local_78.field_2.
                                                                 _M_allocated_capacity._1_2_,
                                                                 local_78.field_2._M_local_buf[0])))
                                     )) + 1);
  }
  if (iVar2 != 0) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0x13b);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0x13b);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      local_58 = 0x1a;
      local_78._M_dataplus._M_p = (pointer)paVar4;
      local_78._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_58);
      local_78.field_2._M_local_buf[0] = (char)local_58;
      local_78.field_2._M_allocated_capacity._1_2_ = (undefined2)(local_58 >> 8);
      local_78.field_2._M_local_buf[3] = (char)(local_58 >> 0x18);
      local_78.field_2._M_allocated_capacity._4_2_ = (undefined2)(local_58 >> 0x20);
      local_78.field_2._M_local_buf[6] = (char)(local_58 >> 0x30);
      local_78.field_2._M_local_buf[7] = (char)(local_58 >> 0x38);
      builtin_strncpy(local_78._M_dataplus._M_p,"/path/to/another.file.docx",0x1a);
      local_78._M_string_length = local_58;
      local_78._M_dataplus._M_p[local_58] = '\0';
      ExtractBasePath(&local_50,&local_78);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      pcVar3 = "false";
      if (iVar2 == 0) {
        pcVar3 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar5) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT17(local_78.field_2._M_local_buf[7],
                                 CONCAT16(local_78.field_2._M_local_buf[6],
                                          CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_78.field_2._M_local_buf[3],
                                                            CONCAT21(local_78.field_2.
                                                                     _M_allocated_capacity._1_2_,
                                                                     local_78.field_2._M_local_buf
                                                                     [0]))))) + 1);
      }
    }
    local_58 = 0x1a;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_58);
    local_78.field_2._M_local_buf[0] = (char)local_58;
    local_78.field_2._M_allocated_capacity._1_2_ = (undefined2)(local_58 >> 8);
    local_78.field_2._M_local_buf[3] = (char)(local_58 >> 0x18);
    local_78.field_2._M_allocated_capacity._4_2_ = (undefined2)(local_58 >> 0x20);
    local_78.field_2._M_local_buf[6] = (char)(local_58 >> 0x30);
    local_78.field_2._M_local_buf[7] = (char)(local_58 >> 0x38);
    builtin_strncpy(local_78._M_dataplus._M_p,"/path/to/another.file.docx",0x1a);
    local_78._M_string_length = local_58;
    local_78._M_dataplus._M_p[local_58] = '\0';
    ExtractBasePath(&local_50,&local_78);
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    pcVar3 = "false";
    if (iVar2 == 0) {
      pcVar3 = "true";
    }
    printf("    Actual : %s\n",pcVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar5) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT17(local_78.field_2._M_local_buf[7],
                               CONCAT16(local_78.field_2._M_local_buf[6],
                                        CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                 CONCAT13(local_78.field_2._M_local_buf[3],
                                                          CONCAT21(local_78.field_2.
                                                                   _M_allocated_capacity._1_2_,
                                                                   local_78.field_2._M_local_buf[0])
                                                         )))) + 1);
    }
    *utest_result = 1;
  }
  paVar4 = &local_78.field_2;
  local_78.field_2._M_local_buf[0] = 'e';
  local_78.field_2._M_allocated_capacity._1_2_ = 0x6178;
  local_78.field_2._M_local_buf[3] = 'm';
  local_78.field_2._M_allocated_capacity._4_2_ = 0x6c70;
  local_78.field_2._M_local_buf[6] = 'e';
  local_78._M_string_length = 7;
  local_78.field_2._7_4_ = local_78.field_2._7_4_ & 0xffffff00;
  local_78._M_dataplus._M_p = (pointer)paVar4;
  ExtractBasePath(&local_50,&local_78);
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar5) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar4) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                               CONCAT13(local_78.field_2._M_local_buf[3],
                                                        CONCAT21(local_78.field_2.
                                                                 _M_allocated_capacity._1_2_,
                                                                 local_78.field_2._M_local_buf[0])))
                                     )) + 1);
  }
  if (iVar2 != 0) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0x13c);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0x13c);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      local_78.field_2._M_local_buf[0] = 'e';
      local_78.field_2._M_allocated_capacity._1_2_ = 0x6178;
      local_78.field_2._M_local_buf[3] = 'm';
      local_78.field_2._M_allocated_capacity._4_2_ = 0x6c70;
      local_78.field_2._M_local_buf[6] = 'e';
      local_78._M_string_length = 7;
      local_78.field_2._7_4_ = local_78.field_2._7_4_ & 0xffffff00;
      local_78._M_dataplus._M_p = (pointer)paVar4;
      ExtractBasePath(&local_50,&local_78);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      pcVar3 = "false";
      if (iVar2 == 0) {
        pcVar3 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar5) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT17(local_78.field_2._M_local_buf[7],
                                 CONCAT16(local_78.field_2._M_local_buf[6],
                                          CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_78.field_2._M_local_buf[3],
                                                            CONCAT21(local_78.field_2.
                                                                     _M_allocated_capacity._1_2_,
                                                                     local_78.field_2._M_local_buf
                                                                     [0]))))) + 1);
      }
    }
    local_78.field_2._M_local_buf[0] = 'e';
    local_78.field_2._M_allocated_capacity._1_2_ = 0x6178;
    local_78.field_2._M_local_buf[3] = 'm';
    local_78.field_2._M_allocated_capacity._4_2_ = 0x6c70;
    local_78.field_2._M_local_buf[6] = 'e';
    local_78._M_string_length = 7;
    local_78.field_2._7_4_ = local_78.field_2._7_4_ & 0xffffff00;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ExtractBasePath(&local_50,&local_78);
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    pcVar3 = "false";
    if (iVar2 == 0) {
      pcVar3 = "true";
    }
    printf("    Actual : %s\n",pcVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar5) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT17(local_78.field_2._M_local_buf[7],
                               CONCAT16(local_78.field_2._M_local_buf[6],
                                        CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                 CONCAT13(local_78.field_2._M_local_buf[3],
                                                          CONCAT21(local_78.field_2.
                                                                   _M_allocated_capacity._1_2_,
                                                                   local_78.field_2._M_local_buf[0])
                                                         )))) + 1);
    }
    *utest_result = 1;
  }
  paVar4 = &local_78.field_2;
  local_78.field_2._M_local_buf[0] = 'e';
  local_78.field_2._M_allocated_capacity._1_2_ = 0x6178;
  local_78.field_2._M_local_buf[3] = 'm';
  local_78.field_2._M_allocated_capacity._4_2_ = 0x6c70;
  local_78.field_2._M_local_buf[6] = 'e';
  local_78.field_2._7_4_ = 0x7478742e;
  local_78._M_string_length = 0xb;
  local_78.field_2._M_local_buf[0xb] = '\0';
  local_78._M_dataplus._M_p = (pointer)paVar4;
  ExtractBasePath(&local_50,&local_78);
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar5) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar4) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                               CONCAT13(local_78.field_2._M_local_buf[3],
                                                        CONCAT21(local_78.field_2.
                                                                 _M_allocated_capacity._1_2_,
                                                                 local_78.field_2._M_local_buf[0])))
                                     )) + 1);
  }
  if (iVar2 != 0) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0x13d);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0x13d);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      local_78.field_2._M_local_buf[0] = 'e';
      local_78.field_2._M_allocated_capacity._1_2_ = 0x6178;
      local_78.field_2._M_local_buf[3] = 'm';
      local_78.field_2._M_allocated_capacity._4_2_ = 0x6c70;
      local_78.field_2._M_local_buf[6] = 'e';
      local_78.field_2._7_4_ = 0x7478742e;
      local_78._M_string_length = 0xb;
      local_78.field_2._M_local_buf[0xb] = '\0';
      local_78._M_dataplus._M_p = (pointer)paVar4;
      ExtractBasePath(&local_50,&local_78);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      pcVar3 = "false";
      if (iVar2 == 0) {
        pcVar3 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar5) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT17(local_78.field_2._M_local_buf[7],
                                 CONCAT16(local_78.field_2._M_local_buf[6],
                                          CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_78.field_2._M_local_buf[3],
                                                            CONCAT21(local_78.field_2.
                                                                     _M_allocated_capacity._1_2_,
                                                                     local_78.field_2._M_local_buf
                                                                     [0]))))) + 1);
      }
    }
    local_78.field_2._M_local_buf[0] = 'e';
    local_78.field_2._M_allocated_capacity._1_2_ = 0x6178;
    local_78.field_2._M_local_buf[3] = 'm';
    local_78.field_2._M_allocated_capacity._4_2_ = 0x6c70;
    local_78.field_2._M_local_buf[6] = 'e';
    local_78.field_2._7_4_ = 0x7478742e;
    local_78._M_string_length = 0xb;
    local_78.field_2._M_local_buf[0xb] = '\0';
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ExtractBasePath(&local_50,&local_78);
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    pcVar3 = "false";
    if (iVar2 == 0) {
      pcVar3 = "true";
    }
    printf("    Actual : %s\n",pcVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar5) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT17(local_78.field_2._M_local_buf[7],
                               CONCAT16(local_78.field_2._M_local_buf[6],
                                        CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                 CONCAT13(local_78.field_2._M_local_buf[3],
                                                          CONCAT21(local_78.field_2.
                                                                   _M_allocated_capacity._1_2_,
                                                                   local_78.field_2._M_local_buf[0])
                                                         )))) + 1);
    }
    *utest_result = 1;
  }
  paVar4 = &local_78.field_2;
  local_78.field_2._M_local_buf[0] = '.';
  local_78.field_2._M_allocated_capacity._1_2_ = 0x662f;
  local_78.field_2._M_local_buf[3] = 'i';
  local_78.field_2._M_allocated_capacity._4_2_ = 0x656c;
  local_78.field_2._M_local_buf[6] = 'n';
  local_78.field_2._7_4_ = 0x2e656d61;
  local_78.field_2._M_local_buf[0xb] = 't';
  local_78.field_2._12_2_ = 0x7478;
  local_78._M_string_length = 0xe;
  local_78.field_2._M_local_buf[0xe] = '\0';
  local_78._M_dataplus._M_p = (pointer)paVar4;
  ExtractBasePath(&local_50,&local_78);
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar4) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                               CONCAT13(local_78.field_2._M_local_buf[3],
                                                        CONCAT21(local_78.field_2.
                                                                 _M_allocated_capacity._1_2_,
                                                                 local_78.field_2._M_local_buf[0])))
                                     )) + 1);
  }
  if (iVar2 != 0) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0x13e);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0x13e);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      local_78.field_2._M_local_buf[0] = '.';
      local_78.field_2._M_allocated_capacity._1_2_ = 0x662f;
      local_78.field_2._M_local_buf[3] = 'i';
      local_78.field_2._M_allocated_capacity._4_2_ = 0x656c;
      local_78.field_2._M_local_buf[6] = 'n';
      local_78.field_2._7_4_ = 0x2e656d61;
      local_78.field_2._M_local_buf[0xb] = 't';
      local_78.field_2._12_2_ = 0x7478;
      local_78._M_string_length = 0xe;
      local_78.field_2._M_local_buf[0xe] = '\0';
      local_78._M_dataplus._M_p = (pointer)paVar4;
      ExtractBasePath(&local_50,&local_78);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      pcVar3 = "false";
      if (iVar2 == 0) {
        pcVar3 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT17(local_78.field_2._M_local_buf[7],
                                 CONCAT16(local_78.field_2._M_local_buf[6],
                                          CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_78.field_2._M_local_buf[3],
                                                            CONCAT21(local_78.field_2.
                                                                     _M_allocated_capacity._1_2_,
                                                                     local_78.field_2._M_local_buf
                                                                     [0]))))) + 1);
      }
    }
    local_78.field_2._M_local_buf[0] = '.';
    local_78.field_2._M_allocated_capacity._1_2_ = 0x662f;
    local_78.field_2._M_local_buf[3] = 'i';
    local_78.field_2._M_allocated_capacity._4_2_ = 0x656c;
    local_78.field_2._M_local_buf[6] = 'n';
    local_78.field_2._7_4_ = 0x2e656d61;
    local_78.field_2._M_local_buf[0xb] = 't';
    local_78.field_2._12_2_ = 0x7478;
    local_78._M_string_length = 0xe;
    local_78.field_2._M_local_buf[0xe] = '\0';
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ExtractBasePath(&local_50,&local_78);
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    pcVar3 = "false";
    if (iVar2 == 0) {
      pcVar3 = "true";
    }
    printf("    Actual : %s\n",pcVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT17(local_78.field_2._M_local_buf[7],
                               CONCAT16(local_78.field_2._M_local_buf[6],
                                        CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                 CONCAT13(local_78.field_2._M_local_buf[3],
                                                          CONCAT21(local_78.field_2.
                                                                   _M_allocated_capacity._1_2_,
                                                                   local_78.field_2._M_local_buf[0])
                                                         )))) + 1);
    }
    *utest_result = 1;
  }
  paVar5 = &local_78.field_2;
  local_58 = 0x17;
  local_78._M_dataplus._M_p = (pointer)paVar5;
  local_78._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_58);
  local_78.field_2._M_local_buf[0] = (char)local_58;
  local_78.field_2._M_allocated_capacity._1_2_ = (undefined2)(local_58 >> 8);
  local_78.field_2._M_local_buf[3] = (char)(local_58 >> 0x18);
  local_78.field_2._M_allocated_capacity._4_2_ = (undefined2)(local_58 >> 0x20);
  local_78.field_2._M_local_buf[6] = (char)(local_58 >> 0x30);
  local_78.field_2._M_local_buf[7] = (char)(local_58 >> 0x38);
  builtin_strncpy(local_78._M_dataplus._M_p,"path/with/no/extension/",0x17);
  local_78._M_string_length = local_58;
  local_78._M_dataplus._M_p[local_58] = '\0';
  ExtractBasePath(&local_50,&local_78);
  paVar4 = &local_50.field_2;
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar4) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar5) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                               CONCAT13(local_78.field_2._M_local_buf[3],
                                                        CONCAT21(local_78.field_2.
                                                                 _M_allocated_capacity._1_2_,
                                                                 local_78.field_2._M_local_buf[0])))
                                     )) + 1);
  }
  if (iVar2 != 0) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0x13f);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0x13f);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      local_58 = 0x17;
      local_78._M_dataplus._M_p = (pointer)paVar5;
      local_78._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_58);
      local_78.field_2._M_local_buf[0] = (char)local_58;
      local_78.field_2._M_allocated_capacity._1_2_ = (undefined2)(local_58 >> 8);
      local_78.field_2._M_local_buf[3] = (char)(local_58 >> 0x18);
      local_78.field_2._M_allocated_capacity._4_2_ = (undefined2)(local_58 >> 0x20);
      local_78.field_2._M_local_buf[6] = (char)(local_58 >> 0x30);
      local_78.field_2._M_local_buf[7] = (char)(local_58 >> 0x38);
      builtin_strncpy(local_78._M_dataplus._M_p,"path/with/no/extension/",0x17);
      local_78._M_string_length = local_58;
      local_78._M_dataplus._M_p[local_58] = '\0';
      ExtractBasePath(&local_50,&local_78);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      pcVar3 = "false";
      if (iVar2 == 0) {
        pcVar3 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar4) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT17(local_78.field_2._M_local_buf[7],
                                 CONCAT16(local_78.field_2._M_local_buf[6],
                                          CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_78.field_2._M_local_buf[3],
                                                            CONCAT21(local_78.field_2.
                                                                     _M_allocated_capacity._1_2_,
                                                                     local_78.field_2._M_local_buf
                                                                     [0]))))) + 1);
      }
    }
    local_58 = 0x17;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_58);
    local_78.field_2._M_local_buf[0] = (char)local_58;
    local_78.field_2._M_allocated_capacity._1_2_ = (undefined2)(local_58 >> 8);
    local_78.field_2._M_local_buf[3] = (char)(local_58 >> 0x18);
    local_78.field_2._M_allocated_capacity._4_2_ = (undefined2)(local_58 >> 0x20);
    local_78.field_2._M_local_buf[6] = (char)(local_58 >> 0x30);
    local_78.field_2._M_local_buf[7] = (char)(local_58 >> 0x38);
    builtin_strncpy(local_78._M_dataplus._M_p,"path/with/no/extension/",0x17);
    local_78._M_string_length = local_58;
    local_78._M_dataplus._M_p[local_58] = '\0';
    ExtractBasePath(&local_50,&local_78);
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    pcVar3 = "false";
    if (iVar2 == 0) {
      pcVar3 = "true";
    }
    printf("    Actual : %s\n",pcVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar4) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT17(local_78.field_2._M_local_buf[7],
                               CONCAT16(local_78.field_2._M_local_buf[6],
                                        CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                 CONCAT13(local_78.field_2._M_local_buf[3],
                                                          CONCAT21(local_78.field_2.
                                                                   _M_allocated_capacity._1_2_,
                                                                   local_78.field_2._M_local_buf[0])
                                                         )))) + 1);
    }
    *utest_result = 1;
  }
  paVar5 = &local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)paVar5;
  ExtractBasePath(&local_50,&local_78);
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar4) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar5) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT17(local_78.field_2._M_local_buf[7],
                             CONCAT16(local_78.field_2._M_local_buf[6],
                                      CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                               CONCAT13(local_78.field_2._M_local_buf[3],
                                                        CONCAT21(local_78.field_2.
                                                                 _M_allocated_capacity._1_2_,
                                                                 local_78.field_2._M_local_buf[0])))
                                     )) + 1);
  }
  if (iVar2 != 0) {
    if (utest_state.output != (FILE *)0x0) {
      fprintf((FILE *)utest_state.output,"%s:%u: Failure\n",
              "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
              ,0x140);
    }
    printf("%s:%u: Failure\n",
           "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/tests/liveglsl_tests.cpp"
           ,0x140);
    if (utest_state.output != (FILE *)0x0) {
      fwrite("  Expected : true\n",0x12,1,(FILE *)utest_state.output);
    }
    puts("  Expected : true");
    pFVar1 = utest_state.output;
    if (utest_state.output != (FILE *)0x0) {
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      local_78._M_dataplus._M_p = (pointer)paVar5;
      ExtractBasePath(&local_50,&local_78);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      pcVar3 = "false";
      if (iVar2 == 0) {
        pcVar3 = "true";
      }
      fprintf((FILE *)pFVar1,"    Actual : %s\n",pcVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar4) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT17(local_78.field_2._M_local_buf[7],
                                 CONCAT16(local_78.field_2._M_local_buf[6],
                                          CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_78.field_2._M_local_buf[3],
                                                            CONCAT21(local_78.field_2.
                                                                     _M_allocated_capacity._1_2_,
                                                                     local_78.field_2._M_local_buf
                                                                     [0]))))) + 1);
      }
    }
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ExtractBasePath(&local_50,&local_78);
    iVar2 = std::__cxx11::string::compare((char *)&local_50);
    pcVar3 = "false";
    if (iVar2 == 0) {
      pcVar3 = "true";
    }
    printf("    Actual : %s\n",pcVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar4) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT17(local_78.field_2._M_local_buf[7],
                               CONCAT16(local_78.field_2._M_local_buf[6],
                                        CONCAT24(local_78.field_2._M_allocated_capacity._4_2_,
                                                 CONCAT13(local_78.field_2._M_local_buf[3],
                                                          CONCAT21(local_78.field_2.
                                                                   _M_allocated_capacity._1_2_,
                                                                   local_78.field_2._M_local_buf[0])
                                                         )))) + 1);
    }
    *utest_result = 1;
  }
  return;
}

Assistant:

UTEST(utils, utils_extract_base_path) {
    T(ExtractBasePath("/path/to/file.txt") == "/path/to");
    T(ExtractBasePath("/path/to/another.file.docx") == "/path/to");
    T(ExtractBasePath("example") == "");
    T(ExtractBasePath("example.txt") == "");
    T(ExtractBasePath("./filename.txt") == ".");
    T(ExtractBasePath("path/with/no/extension/") == "path/with/no/extension");
    T(ExtractBasePath("") == "");
}